

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_setCookie
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  ushort *puVar2;
  ushort *puVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 *puVar6;
  char *pcVar7;
  ulong __n;
  ulong len;
  long lVar8;
  size_t vdomlen;
  size_t vpathlen;
  char *vdom;
  char *vpath;
  size_t cdomlen;
  size_t cpathlen;
  char *cdom;
  char *cpath;
  size_t local_70;
  size_t local_68;
  char *local_60;
  char *local_58;
  size_t local_50;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  if (oargc == (uint *)0x0) {
    lVar8 = 0;
  }
  else {
    lVar8 = (long)(int)*oargc;
  }
  if (getp_setCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_setCookie();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_setCookie::desc);
  if (iVar1 == 0) {
    puVar2 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -2);
    if ((puVar2 == (ushort *)0x0) || (puVar3 == (ushort *)0x0)) {
      err_throw(0x900);
    }
    __n = (ulong)*puVar2;
    len = (ulong)*puVar3;
    puVar3 = puVar3 + 1;
    pcVar4 = lib_copy_str((char *)puVar3,len);
    parse_attr_token(pcVar4,"path",&local_38,&local_48);
    parse_attr_token(pcVar4,"domain",&local_40,&local_50);
    for (puVar6 = *(undefined8 **)((this->super_CVmObject).ext_ + 8); puVar6 != (undefined8 *)0x0;
        puVar6 = (undefined8 *)puVar6[2]) {
      pcVar7 = (char *)*puVar6;
      sVar5 = strlen(pcVar7);
      if ((sVar5 == __n) && (iVar1 = bcmp(pcVar7,puVar2 + 1,__n), iVar1 == 0)) {
        parse_attr_token((char *)puVar6[1],"path",&local_58,&local_68);
        parse_attr_token((char *)puVar6[1],"domain",&local_60,&local_70);
        if (((local_68 == local_48) &&
            (((local_48 == 0 || (iVar1 = bcmp(local_58,local_38,local_68), iVar1 == 0)) &&
             (local_70 == local_50)))) &&
           ((local_50 == 0 || (iVar1 = bcmp(local_60,local_40,local_70), iVar1 == 0)))) {
          lib_free_str((char *)puVar6[1]);
          pcVar7 = lib_copy_str((char *)puVar3,len);
          puVar6[1] = pcVar7;
          lib_free_str(pcVar4);
          if (puVar6 == (undefined8 *)0x0) goto LAB_00206f13;
          goto LAB_00206f5c;
        }
      }
    }
    lib_free_str(pcVar4);
LAB_00206f13:
    puVar6 = (undefined8 *)operator_new(0x18);
    pcVar4 = lib_copy_str((char *)(puVar2 + 1),__n);
    *puVar6 = pcVar4;
    pcVar4 = lib_copy_str((char *)puVar3,len);
    puVar6[1] = pcVar4;
    puVar6[2] = 0;
    pcVar4 = (this->super_CVmObject).ext_;
    puVar6[2] = *(undefined8 *)(pcVar4 + 8);
    *(undefined8 **)(pcVar4 + 8) = puVar6;
LAB_00206f5c:
    sp_ = sp_ + -lVar8;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_setCookie(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the cookie name and value */
    const char *cname = G_stk->get(0)->get_as_string(vmg0_);
    const char *cval = G_stk->get(1)->get_as_string(vmg0_);

    /* check that we got string values */
    if (cname == 0 || cval == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the name and value length and buffer */
    size_t cname_len = vmb_get_len(cname), cval_len = vmb_get_len(cval);
    cname += VMB_LEN;
    cval += VMB_LEN;

    /* get a null-terminated copy of the value, and parse out the 'path' */
    char *cbuf = lib_copy_str(cval, cval_len);
    const char *cpath, *cdom;
    size_t cpathlen, cdomlen;
    parse_attr_token(cbuf, "path", cpath, cpathlen);
    parse_attr_token(cbuf, "domain", cdom, cdomlen);

    /* search for an existing cookie with this name */
    vm_httpreq_cookie *cookie;
    for (cookie = get_ext()->cookies ; cookie != 0 ; cookie = cookie->nxt)
    {
        /* check for a match */
        if (strlen(cookie->name) == cname_len
            && memcmp(cookie->name, cname, cname_len) == 0)
        {
            /* parse the current value's path and domain attributes */
            const char *vpath, *vdom;
            size_t vpathlen, vdomlen;
            parse_attr_token(cookie->val, "path", vpath, vpathlen);
            parse_attr_token(cookie->val, "domain", vdom, vdomlen);

            /*   
             *   Check to see if the path and domain match.  If not, this
             *   counts as a distinct cookie.  
             */
            if (!match_attrs(vpath, vpathlen, cpath, cpathlen)
                || !match_attrs(vdom, vdomlen, cdom, cdomlen))
                continue;

            /* it's already defined - redefine it with the new value */
            lib_free_str(cookie->val);
            cookie->val = lib_copy_str(cval, cval_len);
            break;
        }
    }

    /* done with the allocated value copy */
    lib_free_str(cbuf);

    /* if we didn't replace an existing entry, create a new one */
    if (cookie == 0)
    {
        /* create the entry */
        cookie = new vm_httpreq_cookie(cname, cname_len, cval, cval_len);

        /* link it into our list */
        cookie->nxt = get_ext()->cookies;
        get_ext()->cookies = cookie;
    }

    /* done with the arguments */
    G_stk->discard(argc);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}